

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mbedtls_wrapper.cpp
# Opt level: O2

void __thiscall duckdb_mbedtls::MbedTlsWrapper::SHA1State::FinishHex(SHA1State *this,char *out)

{
  mbedtls_sha1_context *ctx;
  int iVar1;
  runtime_error *this_00;
  string hash;
  
  ctx = (mbedtls_sha1_context *)this->sha_context;
  hash._M_dataplus._M_p = (pointer)&hash.field_2;
  hash._M_string_length = 0;
  hash.field_2._M_local_buf[0] = '\0';
  std::__cxx11::string::resize((ulong)&hash);
  iVar1 = mbedtls_sha1_finish(ctx,(uchar *)hash._M_dataplus._M_p);
  if (iVar1 == 0) {
    ToBase16(hash._M_dataplus._M_p,out,0x14);
    std::__cxx11::string::~string((string *)&hash);
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"SHA1 Error");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void MbedTlsWrapper::SHA1State::FinishHex(char *out) {
	auto context = reinterpret_cast<mbedtls_sha1_context *>(sha_context);

	string hash;
	hash.resize(MbedTlsWrapper::SHA1_HASH_LENGTH_BYTES);

	if (mbedtls_sha1_finish(context, (unsigned char *)hash.data())) {
		throw std::runtime_error("SHA1 Error");
	}

	MbedTlsWrapper::ToBase16(const_cast<char *>(hash.c_str()), out, MbedTlsWrapper::SHA1_HASH_LENGTH_BYTES);
}